

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtree.c
# Opt level: O1

void rbtree_rotate_left(RBTREE *tree,RBTREE_NODE *parent,RBTREE_NODE *node)

{
  RBTREE_NODE *pRVar1;
  RBTREE_NODE *pRVar2;
  
  pRVar1 = node->r;
  pRVar2 = pRVar1->lc;
  node->r = (RBTREE_NODE *)((ulong)pRVar2 & 0xfffffffffffffffe);
  pRVar1->lc = (RBTREE_NODE *)((ulong)((uint)pRVar2 & 1) | (ulong)node);
  if (parent == (RBTREE_NODE *)0x0) {
    tree->root = pRVar1;
    return;
  }
  if ((RBTREE_NODE *)((ulong)parent->lc & 0xfffffffffffffffe) != node) {
    if (parent->r != node) {
      return;
    }
    parent->r = pRVar1;
    return;
  }
  parent->lc = (RBTREE_NODE *)((ulong)((uint)parent->lc & 1) | (ulong)pRVar1);
  return;
}

Assistant:

static void
rbtree_rotate_left(RBTREE* tree, RBTREE_NODE* parent, RBTREE_NODE* node)
{
    RBTREE_NODE* tmp;

    tmp = RIGHT(node);
    SET_RIGHT(node, LEFT(tmp));
    SET_LEFT(tmp, node);

    if(parent != NULL) {
        if(node == LEFT(parent))
            SET_LEFT(parent, tmp);
        else if(node == RIGHT(parent))
            SET_RIGHT(parent, tmp);
    } else {
        tree->root = tmp;
    }
}